

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O1

bool __thiscall Js::AsmJsModuleCompiler::CompileAllFunctions(AsmJsModuleCompiler *this)

{
  undefined1 *puVar1;
  int iVar2;
  AsmJsFunc *func;
  bool bVar3;
  Type *ppAVar4;
  int funcIndex;
  int index;
  int iVar5;
  int j;
  int funcIndex_00;
  bool local_31;
  
  iVar2 = (this->mFunctionArray).
          super_ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>.count;
  local_31 = iVar2 < 1;
  if (0 < iVar2) {
    index = 0;
    iVar5 = 1;
    do {
      ppAVar4 = JsUtil::
                List<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(&this->mFunctionArray,index);
      func = *ppAVar4;
      bVar3 = CompileFunction(this,func,funcIndex);
      if (bVar3) {
        puVar1 = &func->field_0xd3;
        *puVar1 = *puVar1 | 1;
      }
      else {
        funcIndex_00 = 0;
        do {
          RevertFunction(this,funcIndex_00);
          funcIndex_00 = funcIndex_00 + 1;
        } while (iVar5 != funcIndex_00);
      }
      if (!bVar3) {
        return local_31;
      }
      index = index + 1;
      iVar5 = iVar5 + 1;
      local_31 = iVar2 <= index;
    } while (index != iVar2);
  }
  return local_31;
}

Assistant:

bool AsmJsModuleCompiler::CompileAllFunctions()
    {
        const int size = mFunctionArray.Count();

        for (int i = 0; i < size; i++)
        {
            AsmJsFunc* func = mFunctionArray.Item(i);

            if (!CompileFunction(func, i))
            {
                // an error occurred in the function, revert state on all asm.js functions
                for (int j = 0; j <= i; j++)
                {
                    RevertFunction(j);
                }
                return false;
            }
            func->Finish();
        }
        return true;
    }